

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O2

void __thiscall HighsConflictPool::performAging(HighsConflictPool *this)

{
  int *piVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer psVar4;
  pointer piVar5;
  int iVar6;
  short sVar7;
  ulong uVar8;
  ulong uVar9;
  
  ppVar2 = (this->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar3 = (this->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)(uint)this->agelim_;
  iVar6 = getNumConflicts(this);
  for (; (5 < (int)uVar9 && (this->softlimit_ < iVar6)); iVar6 = iVar6 - *piVar1) {
    piVar1 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar9;
    uVar9 = uVar9 - 1;
  }
  for (uVar8 = 0; ((ulong)((long)ppVar2 - (long)ppVar3) >> 3 & 0xffffffff) != uVar8;
      uVar8 = uVar8 + 1) {
    psVar4 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar7 = psVar4[uVar8];
    if (-1 < (long)sVar7) {
      piVar5 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar5 + sVar7;
      *piVar1 = *piVar1 + -1;
      sVar7 = sVar7 + 1;
      psVar4[uVar8] = sVar7;
      if ((int)uVar9 < (int)sVar7) {
        psVar4[uVar8] = -1;
        removeConflict(this,(HighsInt)uVar8);
      }
      else {
        piVar1 = piVar5 + sVar7;
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void HighsConflictPool::performAging() {
  HighsInt conflictMaxIndex = conflictRanges_.size();
  HighsInt agelim = agelim_;
  HighsInt numActiveConflicts = getNumConflicts();
  while (agelim > 5 && numActiveConflicts > softlimit_) {
    numActiveConflicts -= ageDistribution_[agelim];
    --agelim;
  }

  for (HighsInt i = 0; i != conflictMaxIndex; ++i) {
    if (ages_[i] < 0) continue;

    ageDistribution_[ages_[i]] -= 1;
    ages_[i] += 1;

    if (ages_[i] > agelim) {
      ages_[i] = -1;
      removeConflict(i);
    } else
      ageDistribution_[ages_[i]] += 1;
  }
}